

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O0

void __thiscall OpenMD::MoleculeCreator::createConstraintElem(MoleculeCreator *this,Molecule *mol)

{
  bool bVar1;
  ConstraintElem *pCVar2;
  key_type *in_RSI;
  pair<std::_Rb_tree_const_iterator<OpenMD::StuntDouble_*>,_bool> pVar3;
  StuntDouble *in_stack_00000028;
  ConstraintElem *in_stack_00000030;
  StuntDouble *sdB;
  StuntDouble *sdA;
  set<OpenMD::StuntDouble_*,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
  sdSet;
  ConstraintPairIterator cpi;
  ConstraintPair *consPair;
  ConstraintPair *in_stack_fffffffffffffec8;
  key_type *in_stack_fffffffffffffed0;
  set<OpenMD::StuntDouble_*,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
  *in_stack_fffffffffffffed8;
  _Rb_tree_const_iterator<OpenMD::StuntDouble_*> in_stack_fffffffffffffee8;
  iterator in_stack_fffffffffffffef0;
  _Self local_a0;
  _Self local_98;
  StuntDouble *local_90;
  _Base_ptr local_88;
  undefined1 local_80;
  _Self local_78;
  _Self local_70;
  StuntDouble *local_68;
  __normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
  local_20;
  ConstraintPair *local_18;
  key_type *local_10;
  
  local_10 = in_RSI;
  __gnu_cxx::
  __normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
  ::__normal_iterator(&local_20);
  std::
  set<OpenMD::StuntDouble_*,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
  ::set((set<OpenMD::StuntDouble_*,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
         *)0x22d006);
  local_18 = Molecule::beginConstraintPair
                       ((Molecule *)in_stack_fffffffffffffef0._M_node,
                        (iterator *)in_stack_fffffffffffffee8._M_node);
  while (local_18 != (ConstraintPair *)0x0) {
    pCVar2 = ConstraintPair::getConsElem1(local_18);
    local_68 = ConstraintElem::getStuntDouble(pCVar2);
    local_70._M_node =
         (_Base_ptr)
         std::
         set<OpenMD::StuntDouble_*,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
         ::find(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    local_78._M_node =
         (_Base_ptr)
         std::
         set<OpenMD::StuntDouble_*,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
         ::end((set<OpenMD::StuntDouble_*,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
                *)in_stack_fffffffffffffec8);
    bVar1 = std::operator==(&local_70,&local_78);
    if (bVar1) {
      pVar3 = std::
              set<OpenMD::StuntDouble_*,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
              ::insert((set<OpenMD::StuntDouble_*,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
                        *)in_stack_fffffffffffffef0._M_node,
                       (value_type *)in_stack_fffffffffffffee8._M_node);
      local_88 = (_Base_ptr)pVar3.first._M_node;
      local_80 = pVar3.second;
      operator_new(0x28);
      ConstraintElem::ConstraintElem(in_stack_00000030,in_stack_00000028);
      Molecule::addConstraintElem
                ((Molecule *)in_stack_fffffffffffffef0._M_node,
                 (ConstraintElem *)in_stack_fffffffffffffee8._M_node);
    }
    pCVar2 = ConstraintPair::getConsElem2(local_18);
    local_90 = ConstraintElem::getStuntDouble(pCVar2);
    in_stack_fffffffffffffef0 =
         std::
         set<OpenMD::StuntDouble_*,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
         ::find(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    local_98._M_node = in_stack_fffffffffffffef0._M_node;
    local_a0._M_node =
         (_Base_ptr)
         std::
         set<OpenMD::StuntDouble_*,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
         ::end((set<OpenMD::StuntDouble_*,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
                *)in_stack_fffffffffffffec8);
    bVar1 = std::operator==(&local_98,&local_a0);
    if (bVar1) {
      pVar3 = std::
              set<OpenMD::StuntDouble_*,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
              ::insert((set<OpenMD::StuntDouble_*,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
                        *)in_stack_fffffffffffffef0._M_node,
                       (value_type *)in_stack_fffffffffffffee8._M_node);
      in_stack_fffffffffffffee8 = pVar3.first._M_node;
      in_stack_fffffffffffffed0 = local_10;
      in_stack_fffffffffffffed8 =
           (set<OpenMD::StuntDouble_*,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
            *)operator_new(0x28);
      ConstraintElem::ConstraintElem(in_stack_00000030,in_stack_00000028);
      Molecule::addConstraintElem
                ((Molecule *)in_stack_fffffffffffffef0._M_node,
                 (ConstraintElem *)in_stack_fffffffffffffee8._M_node);
    }
    in_stack_fffffffffffffec8 =
         Molecule::nextConstraintPair
                   ((Molecule *)in_stack_fffffffffffffef0._M_node,
                    (iterator *)in_stack_fffffffffffffee8._M_node);
    local_18 = in_stack_fffffffffffffec8;
  }
  std::
  set<OpenMD::StuntDouble_*,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
  ::~set((set<OpenMD::StuntDouble_*,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
          *)0x22d2f8);
  return;
}

Assistant:

void MoleculeCreator::createConstraintElem(Molecule* mol) {
    ConstraintPair* consPair;
    Molecule::ConstraintPairIterator cpi;
    std::set<StuntDouble*> sdSet;
    for (consPair = mol->beginConstraintPair(cpi); consPair != NULL;
         consPair = mol->nextConstraintPair(cpi)) {
      StuntDouble* sdA = consPair->getConsElem1()->getStuntDouble();
      if (sdSet.find(sdA) == sdSet.end()) {
        sdSet.insert(sdA);
        mol->addConstraintElem(new ConstraintElem(sdA));
      }

      StuntDouble* sdB = consPair->getConsElem2()->getStuntDouble();
      if (sdSet.find(sdB) == sdSet.end()) {
        sdSet.insert(sdB);
        mol->addConstraintElem(new ConstraintElem(sdB));
      }
    }
  }